

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Decoration __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::TranslateInterpolationDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  bool bVar1;
  TQualifier *qualifier_local;
  TGlslangToSpvTraverser *this_local;
  
  if ((*(ulong *)&qualifier->field_0x8 >> 0x1e & 1) == 0) {
    bVar1 = glslang::TQualifier::isNonPerspective(qualifier);
    if (bVar1) {
      this_local._4_4_ = DecorationNoPerspective;
    }
    else if ((*(ulong *)&qualifier->field_0x8 >> 0x1f & 1) == 0) {
      bVar1 = glslang::TQualifier::isExplicitInterpolation(qualifier);
      if (bVar1) {
        spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
        this_local._4_4_ = DecorationExplicitInterpAMD;
      }
      else {
        this_local._4_4_ = DecorationMax;
      }
    }
    else {
      this_local._4_4_ = DecorationFlat;
    }
  }
  else {
    this_local._4_4_ = DecorationMax;
  }
  return this_local._4_4_;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateInterpolationDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.smooth)
        // Smooth decoration doesn't exist in SPIR-V 1.0
        return spv::DecorationMax;
    else if (qualifier.isNonPerspective())
        return spv::DecorationNoPerspective;
    else if (qualifier.flat)
        return spv::DecorationFlat;
    else if (qualifier.isExplicitInterpolation()) {
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::DecorationExplicitInterpAMD;
    }
    else
        return spv::DecorationMax;
}